

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

Gia_Man_t * Au_NtkDeriveFlatGia(Au_Ntk_t *p)

{
  char *__s;
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_01;
  size_t sVar4;
  char *__dest;
  Au_Obj_t *pAVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Gia_Man_t *pGVar8;
  ulong uVar9;
  uint v;
  int iVar10;
  
  iVar10 = 0;
  printf("Collapsing model \"%s\"...\n",p->pName);
  Au_NtkCleanCopy(p);
  p_01 = Gia_ManStart(0x10000);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p_01->pName = __dest;
  Gia_ManHashAlloc(p_01);
  *(byte *)&p_01->fVerbose = (byte)p_01->fVerbose ^ 1;
  for (; iVar10 < (p->vPis).nSize; iVar10 = iVar10 + 1) {
    pAVar5 = Au_NtkPi(p,iVar10);
    iVar2 = Gia_ManAppendCi(p_01);
    Au_ObjSetCopy(pAVar5,iVar2);
  }
  Au_NtkDeriveFlatGia_rec(p_01,p);
  iVar10 = 0;
  while( true ) {
    if ((p->vPos).nSize <= iVar10) {
      Gia_ManHashStop(p_01);
      Gia_ManSetRegNum(p_01,0);
      pGVar8 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      return pGVar8;
    }
    pAVar5 = Au_NtkPo(p,iVar10);
    uVar3 = Au_ObjCopy(pAVar5);
    if (((int)uVar3 < 0) || (v = uVar3 >> 1, p_01->nObjs <= (int)v)) break;
    pGVar6 = Gia_ManObj(p_01,v);
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && (int)*(uint *)pGVar6 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar6 = Gia_ManAppendObj(p_01);
    pGVar6->field_0x3 = pGVar6->field_0x3 | 0x80;
    iVar2 = Gia_ObjId(p_01,pGVar6);
    uVar7 = (ulong)(iVar2 - v & 0x1fffffff);
    uVar1 = *(ulong *)pGVar6;
    uVar9 = (ulong)((uVar3 & 1) << 0x1d);
    *(ulong *)pGVar6 = uVar9 | uVar1 & 0xffffffffc0000000 | uVar7;
    *(ulong *)pGVar6 =
         uVar9 | uVar1 & 0xe0000000c0000000 | uVar7 |
         (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
    p_00 = p_01->vCos;
    iVar2 = Gia_ObjId(p_01,pGVar6);
    Vec_IntPush(p_00,iVar2);
    if (p_01->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_01,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff),pGVar6);
    }
    Gia_ObjId(p_01,pGVar6);
    iVar10 = iVar10 + 1;
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Au_NtkDeriveFlatGia( Au_Ntk_t * p )
{
    Gia_Man_t * pTemp, * pGia = NULL;
    Au_Obj_t * pTerm;
    int i;
    printf( "Collapsing model \"%s\"...\n", Au_NtkName(p) );
    Au_NtkCleanCopy( p );
    // start the network
    pGia = Gia_ManStart( (1<<16) );
    pGia->pName = Abc_UtilStrsav( Au_NtkName(p) );
//    pGia->pSpec = Abc_UtilStrsav( Au_NtkSpec(p) );
    Gia_ManHashAlloc( pGia );
    Gia_ManFlipVerbose( pGia );
    // create PIs
    Au_NtkForEachPi( p, pTerm, i )
        Au_ObjSetCopy( pTerm, Gia_ManAppendCi(pGia) );
    // recursively flatten hierarchy
    Au_NtkDeriveFlatGia_rec( pGia, p );
    // create POs
    Au_NtkForEachPo( p, pTerm, i )
        Gia_ManAppendCo( pGia, Au_ObjCopy(pTerm) );
    // prepare return value
//    Gia_ManHashProfile( pGia );
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}